

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

void __thiscall duckdb::Connection::~Connection(Connection *this)

{
  ClientContext *pCVar1;
  type pDVar2;
  type this_00;
  type context;
  
  if ((this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    pCVar1 = shared_ptr<duckdb::ClientContext,_true>::operator->(&this->context);
    pDVar2 = shared_ptr<duckdb::DatabaseInstance,_true>::operator*(&pCVar1->db);
    this_00 = unique_ptr<duckdb::ConnectionManager,_std::default_delete<duckdb::ConnectionManager>,_true>
              ::operator*(&pDVar2->connection_manager);
    context = shared_ptr<duckdb::ClientContext,_true>::operator*(&this->context);
    ConnectionManager::RemoveConnection(this_00,context);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->context).internal.
              super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

Connection::~Connection() {
	if (!context) {
		return;
	}
	ConnectionManager::Get(*context->db).RemoveConnection(*context);
}